

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O3

void __thiscall ParserTestIgnoreIndentedComments::Run(ParserTestIgnoreIndentedComments *this)

{
  BindingEnv *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Edge *this_01;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  *pmVar5;
  Node *pNVar6;
  StringPiece path;
  string local_48;
  
  iVar4 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "  #indented comment\nrule cat\n  command = cat $in > $out\n  #generator = 1\n  restat = 1 # comment\n  #comment\nbuild result: cat in_1.cc in-2.O\n  #comment\n"
            );
  pTVar2 = g_current_test;
  if (iVar4 == g_current_test->assertion_failures_) {
    this_00 = &(this->super_ParserTest).state.bindings_;
    pmVar5 = BindingEnv::GetRules_abi_cxx11_(this_00);
    bVar3 = testing::Test::Check
                      (pTVar2,(pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x56,"2u == state.bindings_.GetRules().size()");
    if (bVar3) {
      pmVar5 = BindingEnv::GetRules_abi_cxx11_(this_00);
      pTVar2 = g_current_test;
      iVar4 = std::__cxx11::string::compare
                        (*(char **)((pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left +
                                   2));
      testing::Test::Check
                (pTVar2,iVar4 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x58,"\"cat\" == rule->name()");
      path.len_ = 6;
      path.str_ = "result";
      pNVar6 = State::GetNode(&(this->super_ParserTest).state,path,0);
      pTVar2 = g_current_test;
      this_01 = pNVar6->in_edge_;
      paVar1 = &local_48.field_2;
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"restat","");
      bVar3 = Edge::GetBindingBool(this_01,&local_48);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x5a,"edge->GetBindingBool(\"restat\")");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      pTVar2 = g_current_test;
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"generator","");
      bVar3 = Edge::GetBindingBool(this_01,&local_48);
      testing::Test::Check
                (pTVar2,!bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x5b,"edge->GetBindingBool(\"generator\")");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, IgnoreIndentedComments) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"  #indented comment\n"
"rule cat\n"
"  command = cat $in > $out\n"
"  #generator = 1\n"
"  restat = 1 # comment\n"
"  #comment\n"
"build result: cat in_1.cc in-2.O\n"
"  #comment\n"));

  ASSERT_EQ(2u, state.bindings_.GetRules().size());
  const Rule* rule = state.bindings_.GetRules().begin()->second;
  EXPECT_EQ("cat", rule->name());
  Edge* edge = state.GetNode("result", 0)->in_edge();
  EXPECT_TRUE(edge->GetBindingBool("restat"));
  EXPECT_FALSE(edge->GetBindingBool("generator"));
}